

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# synth_core.cpp
# Opt level: O2

void __thiscall V2ModDel::renderChan(V2ModDel *this,StereoSample *chanbuf,int nsamples)

{
  float dry;
  ulong uVar1;
  bool bVar2;
  
  if ((this->wetout != 0.0) || (NAN(this->wetout))) {
    dry = this->dryout;
    uVar1 = 0;
    if (0 < nsamples) {
      uVar1 = (ulong)(uint)nsamples;
    }
    while (bVar2 = uVar1 != 0, uVar1 = uVar1 - 1, bVar2) {
      processSample(this,chanbuf,(chanbuf->field_0).l + 3.8146973e-06,
                    (chanbuf->field_0).r + 3.8146973e-06,dry);
      chanbuf = chanbuf + 1;
    }
  }
  return;
}

Assistant:

void renderChan(StereoSample *chanbuf, int nsamples)
    {
        if (!wetout)
            return;

        COVER("MODDEL chan");

        float dry = dryout;
        for (int i=0; i < nsamples; i++)
            processSample(&chanbuf[i], chanbuf[i].l + fcdcoffset, chanbuf[i].r + fcdcoffset, dry);
    }